

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_parallel_csv.cpp
# Opt level: O0

bool RunVariableBuffer(string *path,idx_t buffer_size,bool set_temp_dir,
                      ColumnDataCollection *ground_truth,string *add_parameters)

{
  byte bVar1;
  ostream *poVar2;
  string *psVar3;
  idx_t *__val;
  void *pvVar4;
  idx_t *piVar5;
  ColumnDataCollection *in_RCX;
  byte in_DL;
  string *in_RDI;
  string error_message;
  ColumnDataCollection *result;
  bool variable_buffer_size_passed;
  unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
  variable_buffer_size_result;
  Connection multi_conn;
  DuckDB db;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcf0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcf8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd30;
  char *in_stack_fffffffffffffd38;
  string local_230 [32];
  string local_210 [32];
  string local_1f0 [36];
  undefined4 local_1cc;
  ColumnDataCollection *local_1c8;
  byte local_1b9;
  string local_1b8 [32];
  string local_198 [32];
  string local_178 [32];
  string local_158 [32];
  string local_138 [32];
  string local_118 [32];
  string local_f8 [32];
  string local_d8 [15];
  allocator local_c9;
  string local_c8 [32];
  string local_a8 [15];
  allocator local_99;
  string local_98 [32];
  string local_78 [24];
  Connection local_60 [32];
  DuckDB local_40 [24];
  ColumnDataCollection *local_28;
  byte local_19;
  string *local_10;
  byte local_1;
  
  local_19 = in_DL & 1;
  local_28 = in_RCX;
  local_10 = in_RDI;
  duckdb::DuckDB::DuckDB(local_40,(char *)0x0,(DBConfig *)0x0);
  duckdb::Connection::Connection(local_60,local_40);
  if ((local_19 & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_98,"PRAGMA temp_directory=\'offload.tmp\'",&local_99);
    duckdb::Connection::Query(local_78);
    duckdb::
    unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
    ::~unique_ptr((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                   *)0x718a72);
    std::__cxx11::string::~string(local_98);
    std::allocator<char>::~allocator((allocator<char> *)&local_99);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c8,"SET preserve_insertion_order=false;",&local_c9);
  duckdb::Connection::Query(local_a8);
  duckdb::
  unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
  ::~unique_ptr((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                 *)0x718b4f);
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  std::operator+(in_stack_fffffffffffffd38,in_stack_fffffffffffffd30);
  std::operator+(in_stack_fffffffffffffcf8,(char *)in_stack_fffffffffffffcf0);
  std::operator+(in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0);
  std::operator+(in_stack_fffffffffffffcf8,(char *)in_stack_fffffffffffffcf0);
  std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffffd28);
  std::operator+(in_stack_fffffffffffffd28,in_stack_fffffffffffffd20);
  std::operator+(in_stack_fffffffffffffcf8,(char *)in_stack_fffffffffffffcf0);
  duckdb::Connection::Query(local_d8);
  std::__cxx11::string::~string(local_f8);
  std::__cxx11::string::~string(local_118);
  std::__cxx11::string::~string(local_1b8);
  std::__cxx11::string::~string(local_138);
  std::__cxx11::string::~string(local_158);
  std::__cxx11::string::~string(local_178);
  std::__cxx11::string::~string(local_198);
  local_1c8 = (ColumnDataCollection *)0x0;
  duckdb::
  unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
  ::operator->((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                *)in_stack_fffffffffffffcf0);
  bVar1 = duckdb::BaseQueryResult::HasError();
  if ((bVar1 & 1) == 0) {
    local_1b9 = 1;
    duckdb::
    unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
    ::operator->((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                  *)in_stack_fffffffffffffcf0);
    local_1c8 = (ColumnDataCollection *)duckdb::MaterializedQueryResult::Collection();
  }
  else {
    local_1b9 = 0;
  }
  if ((local_28 == (ColumnDataCollection *)0x0) && ((local_1b9 & 1) == 0)) {
    local_1 = 1;
    local_1cc = 1;
  }
  else if (local_28 == (ColumnDataCollection *)0x0) {
    poVar2 = std::operator<<((ostream *)&std::cout,local_10);
    poVar2 = std::operator<<(poVar2," Failed on max buffer but succeeded on variable buffer reading"
                            );
    std::operator<<(poVar2,'\n');
    local_1 = 0;
    local_1cc = 1;
  }
  else if ((local_1b9 & 1) == 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,local_10);
    poVar2 = std::operator<<(poVar2," Variable Buffer failed");
    std::operator<<(poVar2,'\n');
    poVar2 = std::operator<<((ostream *)&std::cout,local_10);
    poVar2 = std::operator<<(poVar2," Buffer Size: ");
    std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffffd28);
    poVar2 = std::operator<<(poVar2,local_1f0);
    std::operator<<(poVar2,'\n');
    std::__cxx11::string::~string(local_1f0);
    duckdb::
    unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
    ::operator->((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                  *)in_stack_fffffffffffffcf0);
    psVar3 = (string *)duckdb::BaseQueryResult::GetError_abi_cxx11_();
    poVar2 = std::operator<<((ostream *)&std::cout,psVar3);
    std::operator<<(poVar2,'\n');
    local_1 = 0;
    local_1cc = 1;
  }
  else {
    psVar3 = local_210;
    std::__cxx11::string::string(psVar3);
    bVar1 = duckdb::ColumnDataCollection::ResultEquals(local_28,local_1c8,psVar3,false);
    local_1 = (bVar1 & 1) != 0;
    if (!(bool)local_1) {
      poVar2 = std::operator<<((ostream *)&std::cout,"truth: ");
      __val = duckdb::ColumnDataCollection::Count(local_28);
      pvVar4 = (void *)std::ostream::operator<<(poVar2,*__val);
      std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
      poVar2 = std::operator<<((ostream *)&std::cout,"resul: ");
      piVar5 = duckdb::ColumnDataCollection::Count(local_1c8);
      pvVar4 = (void *)std::ostream::operator<<(poVar2,*piVar5);
      std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
      poVar2 = std::operator<<((ostream *)&std::cout,local_10);
      poVar2 = std::operator<<(poVar2," Buffer Size: ");
      std::__cxx11::to_string((unsigned_long)__val);
      poVar2 = std::operator<<(poVar2,local_230);
      std::operator<<(poVar2,'\n');
      std::__cxx11::string::~string(local_230);
      poVar2 = std::operator<<((ostream *)&std::cout,local_210);
      std::operator<<(poVar2,'\n');
    }
    local_1cc = 1;
    std::__cxx11::string::~string(local_210);
  }
  duckdb::
  unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
  ::~unique_ptr((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                 *)0x71930c);
  duckdb::Connection::~Connection(local_60);
  duckdb::DuckDB::~DuckDB(local_40);
  return (bool)(local_1 & 1);
}

Assistant:

bool RunVariableBuffer(const string &path, idx_t buffer_size, bool set_temp_dir,
                       ColumnDataCollection *ground_truth = nullptr, const string &add_parameters = "") {
	DuckDB db(nullptr);
	Connection multi_conn(db);
	if (set_temp_dir) {
		multi_conn.Query("PRAGMA temp_directory='offload.tmp'");
	}
	multi_conn.Query("SET preserve_insertion_order=false;");
	duckdb::unique_ptr<MaterializedQueryResult> variable_buffer_size_result =
	    multi_conn.Query("SELECT * FROM read_csv_auto('" + path + "'" + add_parameters +
	                     ", buffer_size = " + to_string(buffer_size) + ") ORDER BY ALL");
	bool variable_buffer_size_passed;
	ColumnDataCollection *result = nullptr;
	if (variable_buffer_size_result->HasError()) {
		variable_buffer_size_passed = false;
	} else {
		variable_buffer_size_passed = true;
		result = &variable_buffer_size_result->Collection();
	}
	if (!ground_truth && !variable_buffer_size_passed) {
		// Two wrongs can make a right
		return true;
	}
	if (!ground_truth) {
		//! oh oh, this should not pass
		std::cout << path << " Failed on max buffer but succeeded on variable buffer reading" << '\n';
		return false;
	}
	if (!variable_buffer_size_passed) {
		std::cout << path << " Variable Buffer failed" << '\n';
		std::cout << path << " Buffer Size: " << to_string(buffer_size) << '\n';
		std::cout << variable_buffer_size_result->GetError() << '\n';
		return false;
	}
	// Results do not match
	string error_message;
	if (!ColumnDataCollection::ResultEquals(*ground_truth, *result, error_message, false)) {
		std::cout << "truth: " << ground_truth->Count() << std::endl;
		std::cout << "resul: " << result->Count() << std::endl;

		std::cout << path << " Buffer Size: " << to_string(buffer_size) << '\n';
		std::cout << error_message << '\n';
		return false;
	}
	return true;
}